

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparseerror.h
# Opt level: O0

void __thiscall QJsonParseError::QJsonParseError(QJsonParseError *this)

{
  QJsonParseError *this_local;
  
  this->offset = -1;
  this->error = NoError;
  return;
}

Assistant:

struct Q_CORE_EXPORT QJsonParseError
{
    enum ParseError {
        NoError = 0,
        UnterminatedObject,
        MissingNameSeparator,
        UnterminatedArray,
        MissingValueSeparator,
        IllegalValue,
        TerminationByNumber,
        IllegalNumber,
        IllegalEscapeSequence,
        IllegalUTF8String,
        UnterminatedString,
        MissingObject,
        DeepNesting,
        DocumentTooLarge,
        GarbageAtEnd
    };

    QString errorString() const;

    int offset = -1;
    ParseError error = NoError;
}